

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1channel_initiate_close(SshChannel *sc,char *err)

{
  char *local_30;
  char *reason;
  ssh1_channel *c;
  char *err_local;
  SshChannel *sc_local;
  
  if (err == (char *)0x0) {
    local_30 = (char *)0x0;
  }
  else {
    local_30 = dupprintf("due to local error: %s",err);
  }
  ssh1_channel_close_local((ssh1_channel *)&sc[-3].cl,local_30);
  safefree(local_30);
  *(undefined1 *)((long)&sc[-1].vt + 4) = 0;
  ssh1_channel_check_close((ssh1_channel *)&sc[-3].cl);
  return;
}

Assistant:

static void ssh1channel_initiate_close(SshChannel *sc, const char *err)
{
    struct ssh1_channel *c = container_of(sc, struct ssh1_channel, sc);
    char *reason;

    reason = err ? dupprintf("due to local error: %s", err) : NULL;
    ssh1_channel_close_local(c, reason);
    sfree(reason);
    c->pending_eof = false;   /* this will confuse a zombie channel */

    ssh1_channel_check_close(c);
}